

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.cpp
# Opt level: O2

error arc::make_closure(shared_ptr<arc::env> *env,atom *args,atom *body,atom *result)

{
  int iVar1;
  atom *paVar2;
  error eVar3;
  atom p;
  shared_ptr<arc::closure> local_60;
  atom local_50;
  
  p.type = T_NIL;
  p.val.
  super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
  .
  super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
  .
  super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
  .
  super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
  .
  super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
  .
  super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
  ._M_index = '\0';
  atom::atom(&local_50,body);
  iVar1 = listp(&local_50);
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                       *)&local_50.val);
  if (iVar1 == 0) {
    eVar3 = ERROR_SYNTAX;
  }
  else {
    atom::operator=(&p,args);
    eVar3 = ERROR_TYPE;
    while (p.type == T_CONS) {
      paVar2 = car(&p);
      if (paVar2->type != T_SYM) {
        paVar2 = car(&p);
        if (paVar2->type != T_CONS) goto LAB_00122f97;
      }
      paVar2 = cdr(&p);
      atom::operator=(&p,paVar2);
    }
    if ((p.type == T_NIL) || (p.type == T_SYM)) {
      result->type = T_CLOSURE;
      std::make_shared<arc::closure,std::shared_ptr<arc::env>const&,arc::atom&,arc::atom&>
                ((shared_ptr<arc::env> *)&local_60,(atom *)env,args);
      std::
      variant<std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
      ::operator=((variant<std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                   *)&result->val,&local_60);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_60.super___shared_ptr<arc::closure,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      eVar3 = ERROR_OK;
    }
  }
LAB_00122f97:
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                       *)&p.val);
  return eVar3;
}

Assistant:

error make_closure(const shared_ptr<struct env>& env, atom args, atom body, atom* result)
	{
		atom p;

		if (!listp(body))
			return ERROR_SYNTAX;

		/* Check argument names are all symbols or conses */
		p = args;
		while (!no(p)) {
			if (p.type == T_SYM)
				break;
			else if (p.type != T_CONS || (car(p).type != T_SYM && car(p).type != T_CONS))
				return ERROR_TYPE;
			p = cdr(p);
		}

		result->type = T_CLOSURE;
		result->val = make_shared<struct closure>(env, args, body);

		return ERROR_OK;
	}